

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<double>::ManagedBuffer
          (ManagedBuffer<double> *this,ManagedBufferRegistry *registry_,string *name_,
          vector<double,_std::allocator<double>_> *data_,function<void_()> *computeFunc_)

{
  uint64_t uVar1;
  undefined8 in_RCX;
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  ManagedBuffer<double> *buffer;
  ManagedBufferRegistry *this_00;
  function<void_()> *in_stack_ffffffffffffff88;
  function<void_()> *in_stack_ffffffffffffff90;
  WeakReferrable *in_stack_ffffffffffffffa0;
  uint64_t *puVar2;
  
  WeakReferrable::WeakReferrable(in_stack_ffffffffffffffa0);
  *in_RDI = 0x98bfd0;
  in_RDI[0x19] = 0x98bff8;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RDX);
  puVar2 = in_RDI + 5;
  uVar1 = internal::getNextUniqueID();
  *puVar2 = uVar1;
  in_RDI[6] = in_RSI;
  in_RDI[7] = in_RCX;
  *(undefined1 *)(in_RDI + 8) = 1;
  std::function<void_()>::function(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *(undefined1 *)(in_RDI + 0xd) = 0;
  buffer = (ManagedBuffer<double> *)(in_RDI + 0xe);
  std::shared_ptr<polyscope::render::AttributeBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::AttributeBuffer> *)0x40f2b4);
  this_00 = (ManagedBufferRegistry *)(in_RDI + 0x10);
  std::shared_ptr<polyscope::render::TextureBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)0x40f2ca);
  *(undefined4 *)(in_RDI + 0x12) = 0;
  *(undefined4 *)((long)in_RDI + 0x94) = 0;
  *(undefined4 *)(in_RDI + 0x13) = 0;
  *(undefined4 *)((long)in_RDI + 0x9c) = 0;
  std::
  vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  ::vector((vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
            *)0x40f308);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x40f31e);
  if (in_RDI[6] != 0) {
    ManagedBufferRegistry::addManagedBuffer<double>(this_00,buffer);
  }
  return;
}

Assistant:

ManagedBuffer<T>::ManagedBuffer(ManagedBufferRegistry* registry_, const std::string& name_, std::vector<T>& data_,
                                std::function<void()> computeFunc_)
    : name(name_), uniqueID(internal::getNextUniqueID()), registry(registry_), data(data_), dataGetsComputed(true),
      computeFunc(computeFunc_), hostBufferIsPopulated(false) {

  if (registry) {
    registry->addManagedBuffer<T>(this);
  }
}